

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O3

void md5_digest(ssh_hash *hash,uint8_t *digest)

{
  int iVar1;
  ssh_hashalg *psVar2;
  size_t i;
  long lVar3;
  uint8_t *p;
  uchar buf [8];
  long local_28;
  
  psVar2 = hash[-2].vt;
  iVar1 = *(int *)&hash[-3].binarysink_;
  BinarySink_put_byte(hash[-1].binarysink_,0x80);
  BinarySink_put_padding(hash[-1].binarysink_,(ulong)(0x37U - iVar1 & 0x3f),'\0');
  local_28 = (long)psVar2 << 3;
  BinarySink_put_data(hash[-1].binarysink_,&local_28,8);
  smemclr(&local_28,8);
  if (hash[-3].binarysink_ == (BinarySink *)0x0) {
    lVar3 = 0;
    do {
      *(undefined4 *)(digest + lVar3 * 4) = *(undefined4 *)((long)hash + lVar3 * 4 + -0x78);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    return;
  }
  __assert_fail("blk->used == 0 && \"Should have exactly hit a block boundary\"",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/md5.c",
                0x61,"void md5_block_pad(md5_block *, BinarySink *)");
}

Assistant:

static void md5_digest(ssh_hash *hash, uint8_t *digest)
{
    md5 *s = container_of(hash, md5, hash);

    md5_block_pad(&s->blk, BinarySink_UPCAST(s));
    for (size_t i = 0; i < 4; i++)
        PUT_32BIT_LSB_FIRST(digest + 4*i, s->core[i]);
}